

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O2

void __thiscall r_exec::Group::cov(Group *this)

{
  char cVar1;
  byte bVar2;
  _Mem *this_00;
  _Base_ptr p_Var3;
  __node_base *p_Var4;
  
  p_Var4 = &(this->viewing_groups)._M_h._M_before_begin;
  while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
    if (*(char *)&((_Prime_rehash_policy *)(p_Var4 + 2))->_M_max_load_factor == '\x01') {
      for (p_Var3 = (this->newly_salient_views)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
          ; (_Rb_tree_header *)p_Var3 !=
            &(this->newly_salient_views)._M_t._M_impl.super__Rb_tree_header;
          p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
        cVar1 = (**(code **)(**(long **)(p_Var3 + 1) + 0x10))();
        if (cVar1 == '\0') {
          (**(code **)(**(long **)(*(long *)(p_Var3 + 1) + 0x20) + 0x20))
                    (*(long **)(*(long *)(p_Var3 + 1) + 0x20),0);
          bVar2 = r_code::Atom::getDescriptor();
          if ((bVar2 & 0xf8) != 200) {
            this_00 = (_Mem *)r_code::Mem::Get();
            _Mem::inject_copy(this_00,*(View **)(p_Var3 + 1),(Group *)p_Var4[1]._M_nxt);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Group::cov()
{
    // cov, i.e. injecting now newly salient views in the viewing groups from which the group is visible and has cov.
    // reduction jobs will be added at each of the eligible viewing groups' own update time.
    std::unordered_map<Group *, bool>::const_iterator vg;

    for (vg = viewing_groups.begin(); vg != viewing_groups.end(); ++vg) {
        if (vg->second) { // cov==true.
            std::multiset<P<View>, r_code::View::Less>::const_iterator v;

            for (v = newly_salient_views.begin(); v != newly_salient_views.end(); ++v) { // no cov for pgm (all sorts), groups, notifications.
                if ((*v)->isNotification()) {
                    continue;
                }

                switch ((*v)->object->code(0).getDescriptor()) {
                case Atom::GROUP:
                case Atom::NULL_PROGRAM:
                case Atom::INSTANTIATED_PROGRAM:
                case Atom::INSTANTIATED_CPP_PROGRAM:
                case Atom::INSTANTIATED_INPUT_LESS_PROGRAM:
                case Atom::INSTANTIATED_ANTI_PROGRAM:
                case Atom::COMPOSITE_STATE:
                case Atom::MODEL:
                    break;

                default:
                    _Mem::Get()->inject_copy(*v, vg->first); // no need to protect group->newly_salient_views[i] since the support values for the ctrl values are not even read.
                    break;
                }
            }
        }
    }
}